

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall google::protobuf::io::CodedInputStream::ExpectAtEnd(CodedInputStream *this)

{
  if ((this->buffer_ == this->buffer_end_) &&
     ((this->buffer_size_after_limit_ != 0 || (this->total_bytes_read_ == this->current_limit_)))) {
    this->last_tag_ = 0;
    this->legitimate_message_end_ = true;
    return true;
  }
  return false;
}

Assistant:

inline bool CodedInputStream::ExpectAtEnd() {
  // If we are at a limit we know no more bytes can be read.  Otherwise, it's
  // hard to say without calling Refresh(), and we'd rather not do that.

  if (buffer_ == buffer_end_ &&
      ((buffer_size_after_limit_ != 0) ||
       (total_bytes_read_ == current_limit_))) {
    last_tag_ = 0;                   // Pretend we called ReadTag()...
    legitimate_message_end_ = true;  // ... and it hit EOF.
    return true;
  } else {
    return false;
  }
}